

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int door_in_range(tgestate_t *state,door_t *door)

{
  byte bVar1;
  uint16_t v;
  uint16_t u;
  int halfdist;
  door_t *door_local;
  tgestate_t *state_local;
  int local_4;
  
  bVar1 = (door->mappos).u;
  if (((int)(uint)(state->saved_mappos).pos16.u < (int)((uint)bVar1 * 4 + -3)) ||
     ((ushort)((ushort)bVar1 * 4 + 3) <= (state->saved_mappos).pos16.u)) {
    local_4 = 1;
  }
  else {
    bVar1 = (door->mappos).v;
    if (((int)(uint)(state->saved_mappos).pos16.v < (int)((uint)bVar1 * 4 + -3)) ||
       ((ushort)((ushort)bVar1 * 4 + 3) <= (state->saved_mappos).pos16.v)) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int door_in_range(tgestate_t *state, const door_t *door)
{
  const int halfdist = 3;

  uint16_t u, v; /* was BC, BC */

  assert(state != NULL);
  assert(door  != NULL);

  u = door->mappos.u * 4;
  if (state->saved_mappos.pos16.u < u - halfdist || state->saved_mappos.pos16.u >= u + halfdist)
    return 1;

  v = door->mappos.v * 4;
  if (state->saved_mappos.pos16.v < v - halfdist || state->saved_mappos.pos16.v >= v + halfdist)
    return 1;

  return 0;
}